

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_file.c
# Opt level: O1

void lu_file_empty(lu_int nlines,lu_int *begin,lu_int *end,lu_int *next,lu_int *prev,lu_int fmem)

{
  ulong uVar1;
  ulong uVar2;
  
  begin[nlines] = 0;
  end[nlines] = fmem;
  if (0 < nlines) {
    uVar2 = 0;
    do {
      end[uVar2] = 0;
      begin[uVar2] = 0;
      uVar2 = uVar2 + 1;
    } while ((uint)nlines != uVar2);
  }
  if (0 < nlines) {
    uVar2 = 0;
    do {
      uVar1 = uVar2 + 1;
      next[uVar2] = (lu_int)uVar1;
      prev[uVar2 + 1] = (lu_int)uVar2;
      uVar2 = uVar1;
    } while ((uint)nlines != uVar1);
  }
  next[nlines] = 0;
  *prev = nlines;
  return;
}

Assistant:

void lu_file_empty(
    lu_int nlines, lu_int *begin, lu_int *end, lu_int *next, lu_int *prev,
    lu_int fmem)
{
    lu_int i;

    begin[nlines] = 0;
    end[nlines] = fmem;
    for (i = 0; i < nlines; i++)
        begin[i] = end[i] = 0;
    for (i = 0; i < nlines; i++)
    {
        next[i] = i+1;
        prev[i+1] = i;
    }
    next[nlines] = 0;
    prev[0] = nlines;
}